

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

void __thiscall camp::ForbiddenRead::ForbiddenRead(ForbiddenRead *this,string *propertyName)

{
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *propertyName_local;
  ForbiddenRead *this_local;
  
  local_18 = propertyName;
  propertyName_local = (string *)this;
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "the property ");
  std::operator+(local_38,(char *)local_58);
  Error::Error(&this->super_Error,local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  *(undefined ***)&this->super_Error = &PTR__ForbiddenRead_001fd2a8;
  return;
}

Assistant:

ForbiddenRead::ForbiddenRead(const std::string& propertyName)
    : Error("the property " + propertyName + " is not readable")
{
}